

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConversion.hxx
# Opt level: O0

WavelengthUnit __thiscall
FileParse::enumFromStringCaseInsensitive<BSDFData::WavelengthUnit,3ul>
          (FileParse *this,string_view name,
          array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
          *values,WavelengthUnit defaultValue)

{
  char *pcVar1;
  __type_conflict _Var2;
  char *pcVar3;
  const_reference this_00;
  __sv_type _Var4;
  string_view str;
  string_view str_00;
  FileParse *local_98;
  char *local_90;
  string local_88;
  char *local_68;
  size_t i;
  size_t local_58;
  undefined1 local_50 [8];
  string lowerName;
  WavelengthUnit defaultValue_local;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
  *values_local;
  string_view name_local;
  
  local_58 = name._M_len;
  lowerName.field_2._12_4_ = SUB84(values,0);
  str._M_str = (char *)values;
  str._M_len = local_58;
  i = (size_t)this;
  toLower_abi_cxx11_((string *)local_50,this,str);
  local_68 = (char *)0x0;
  do {
    pcVar1 = local_68;
    pcVar3 = (char *)std::
                     array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                     ::size((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                             *)name._M_str);
    if (pcVar3 <= pcVar1) {
      name_local._M_str._4_4_ = lowerName.field_2._12_4_;
LAB_00233161:
      std::__cxx11::string::~string((string *)local_50);
      return name_local._M_str._4_4_;
    }
    this_00 = std::
              array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
              ::operator[]((array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_3UL>
                            *)name._M_str,(size_type)local_68);
    _Var4 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
    local_98 = (FileParse *)_Var4._M_len;
    local_90 = _Var4._M_str;
    str_00._M_str = pcVar3;
    str_00._M_len = (size_t)local_90;
    toLower_abi_cxx11_(&local_88,local_98,str_00);
    _Var2 = std::operator==(&local_88,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50);
    std::__cxx11::string::~string((string *)&local_88);
    if (_Var2) {
      name_local._M_str._4_4_ = (WavelengthUnit)local_68;
      goto LAB_00233161;
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

EnumType enumFromStringCaseInsensitive(std::string_view name,
                                           const std::array<std::string, N> & values,
                                           EnumType defaultValue)
    {
        std::string lowerName = toLower(name);
        for(std::size_t i = 0; i < values.size(); ++i)
        {
            if(toLower(values[i]) == lowerName)
            {
                return static_cast<EnumType>(i);
            }
        }

        return defaultValue;
    }